

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9ParseIniString(jx9_context *pCtx,char *zIn,sxu32 nByte,int bProcessSection)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  jx9_value *pjVar4;
  jx9_value *pVal;
  jx9_value *pVal_00;
  ushort **ppuVar5;
  byte *pbVar6;
  SyHashEntry_Pr *pSVar7;
  jx9_value *pjVar8;
  bool bVar9;
  undefined4 in_register_0000000c;
  undefined8 uVar10;
  int iVar11;
  undefined8 extraout_RDX;
  ulong uVar12;
  byte bVar13;
  byte *pbVar14;
  ulong uVar15;
  byte *pbVar16;
  byte *pbVar17;
  sxu32 nKeyLen;
  uint uVar18;
  byte *pbVar19;
  SyHash sHash;
  uint local_a4;
  jx9_value *local_a0;
  jx9_value *local_98;
  SyHash local_70;
  
  uVar10 = CONCAT44(in_register_0000000c,bProcessSection);
  pjVar4 = jx9_context_new_array(pCtx);
  pVal = jx9_context_new_scalar(pCtx);
  pVal_00 = jx9_context_new_scalar(pCtx);
  bVar9 = pVal == (jx9_value *)0x0 || pjVar4 == (jx9_value *)0x0;
  if (pVal_00 == (jx9_value *)0x0 || (pVal == (jx9_value *)0x0 || pjVar4 == (jx9_value *)0x0)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,1,"JX9 is running out of memory");
    pjVar4 = pCtx->pRet;
    jx9MemObjRelease(pjVar4);
    (pjVar4->x).rVal = 0.0;
    uVar3 = pjVar4->iFlags & 0xfffffe90U | 8;
    pjVar4->iFlags = uVar3;
  }
  else {
    SyHashInit(&local_70,&pCtx->pVm->sAllocator,
               (ProcHash)
               CONCAT71((int7)((ulong)extraout_RDX >> 8),pVal_00 == (jx9_value *)0x0 || bVar9),
               (ProcCmp)CONCAT71((int7)((ulong)uVar10 >> 8),bVar9));
    bVar9 = nByte != 0;
    if (bVar9) {
      pbVar17 = (byte *)(zIn + nByte);
      local_a0 = pjVar4;
LAB_00137b60:
      do {
        bVar13 = *zIn;
        if (bVar13 < 0xc0) {
          ppuVar5 = __ctype_b_loc();
          pbVar16 = (byte *)zIn + 1;
          do {
            if ((*(byte *)((long)*ppuVar5 + (long)(char)bVar13 * 2 + 1) & 0x20) == 0) break;
            bVar9 = pbVar16 < pbVar17;
            if (!bVar9) goto LAB_0013826c;
            bVar13 = *pbVar16;
            pbVar16 = pbVar16 + 1;
          } while (bVar13 < 0xc0);
          zIn = (char *)(pbVar16 + -1);
        }
        if (!bVar9) break;
        if ((*zIn == 0x3b) || (*zIn == 0x23)) {
          do {
            zIn = (char *)((byte *)zIn + 1);
            if (pbVar17 <= zIn) break;
          } while (*zIn != 10);
          bVar9 = zIn < pbVar17;
          if (!bVar9) break;
          goto LAB_00137b60;
        }
        (pVal->sBlob).nByte = 0;
        uVar3 = (pVal->sBlob).nFlags;
        if ((uVar3 & 4) != 0) {
          (pVal->sBlob).pBlob = (void *)0x0;
          (pVal->sBlob).mByte = 0;
          (pVal->sBlob).nFlags = uVar3 & 0xfffffffb;
        }
        if (*zIn == 0x5b) {
          pbVar16 = (byte *)zIn + 1;
          uVar15 = 1;
          pbVar14 = pbVar16;
          if (pbVar16 < pbVar17) {
            do {
              if (((byte *)zIn)[uVar15] == 0x5d) break;
              lVar2 = uVar15 + 1;
              uVar15 = uVar15 + 1;
            } while ((byte *)zIn + lVar2 < pbVar17);
            pbVar14 = (byte *)zIn + uVar15;
          }
          if (1 < uVar15 && bProcessSection != 0) {
            uVar3 = (uint)uVar15;
            do {
              pbVar19 = (byte *)zIn;
              pbVar6 = pbVar16;
              uVar3 = uVar3 - 1;
              if (uVar3 == 0) {
                uVar12 = 0;
                break;
              }
              bVar13 = *pbVar6;
              uVar12 = (ulong)uVar3;
              if (0xffffffffffffffbf < (ulong)(long)(char)bVar13) break;
              ppuVar5 = __ctype_b_loc();
              uVar12 = (ulong)((int)uVar15 - 1);
              pbVar16 = pbVar6 + 1;
              uVar15 = uVar12;
              zIn = (char *)(pbVar19 + 1);
            } while ((*(byte *)((long)*ppuVar5 + (long)(char)bVar13 * 2 + 1) & 0x20) != 0);
            pbVar19 = pbVar19 + uVar12;
            do {
              uVar15 = uVar12;
              if (uVar15 == 0) {
                jx9_value_string(pVal,(char *)pbVar6,0);
                goto LAB_001380ed;
              }
              bVar13 = *pbVar19;
              if (0xffffffffffffffbf < (ulong)(long)(char)bVar13) break;
              ppuVar5 = __ctype_b_loc();
              pbVar19 = pbVar19 + -1;
              uVar12 = uVar15 - 1;
            } while ((*(byte *)((long)*ppuVar5 + (long)(char)bVar13 * 2 + 1) & 0x20) != 0);
            jx9_value_string(pVal,(char *)pbVar6,(int)uVar15);
            pjVar8 = jx9_context_new_array(pCtx);
            if ((pjVar8 != (jx9_value *)0x0) && (local_a0 = pjVar8, (pjVar4->iFlags & 0x40) != 0)) {
              HashmapInsert((jx9_hashmap *)(pjVar4->x).pOther,pVal,pjVar8);
            }
          }
LAB_001380ed:
          zIn = (char *)(pbVar14 + 1);
        }
        else {
          pbVar16 = (byte *)zIn;
          local_98 = local_a0;
          if (zIn < pbVar17) {
            local_a4 = 0;
            bVar9 = false;
            do {
              if (*pbVar16 == 0x3d) break;
              if (!bVar9 && *pbVar16 == 0x5b) {
                local_a4 = (int)pbVar16 - (int)zIn;
                pbVar14 = (byte *)zIn;
                uVar3 = local_a4;
                if (0 < (int)local_a4) {
                  do {
                    bVar13 = *pbVar14;
                    if ((0xffffffffffffffbf < (ulong)(long)(char)bVar13) ||
                       (ppuVar5 = __ctype_b_loc(),
                       (*(byte *)((long)*ppuVar5 + (long)(char)bVar13 * 2 + 1) & 0x20) == 0))
                    goto LAB_00137d4a;
                    pbVar14 = pbVar14 + 1;
                    uVar3 = uVar3 - 1;
                  } while (uVar3 != 0);
                  uVar3 = 0;
LAB_00137d4a:
                  uVar18 = ~uVar3;
                  uVar15 = (ulong)uVar3;
                  do {
                    uVar12 = uVar15;
                    if (uVar12 == 0) {
                      nKeyLen = 0;
                      goto LAB_00137d8f;
                    }
                    bVar13 = pbVar14[uVar12 - 1];
                    if (0xffffffffffffffbf < (ulong)(long)(char)bVar13) {
                      nKeyLen = (sxu32)uVar12;
                      goto LAB_00137d8f;
                    }
                    ppuVar5 = __ctype_b_loc();
                    uVar18 = uVar18 + 1;
                    uVar15 = uVar12 - 1;
                  } while ((*(byte *)((long)*ppuVar5 + (long)(char)bVar13 * 2 + 1) & 0x20) != 0);
                  nKeyLen = -uVar18;
LAB_00137d8f:
                  if (uVar12 == 0) {
                    pSVar7 = (SyHashEntry_Pr *)0x0;
                  }
                  else {
                    pSVar7 = (SyHashEntry_Pr *)0x0;
                    if (local_70.nEntry != 0) {
                      pSVar7 = HashGetEntry(&local_70,pbVar14,nKeyLen);
                    }
                  }
                  if (pSVar7 == (SyHashEntry_Pr *)0x0) {
                    pjVar8 = jx9_context_new_array(pCtx);
                    if (pjVar8 == (jx9_value *)0x0) {
                      pjVar8 = (jx9_value *)0x0;
                    }
                    else {
                      SyHashInsert(&local_70,pbVar14,nKeyLen,pjVar8);
                      (pVal->sBlob).nByte = 0;
                      uVar3 = (pVal->sBlob).nFlags;
                      if ((uVar3 & 4) != 0) {
                        (pVal->sBlob).pBlob = (void *)0x0;
                        (pVal->sBlob).mByte = 0;
                        (pVal->sBlob).nFlags = uVar3 & 0xfffffffb;
                      }
                      jx9_value_string(pVal,(char *)pbVar14,nKeyLen);
                      if ((local_98->iFlags & 0x40) != 0) {
                        HashmapInsert((jx9_hashmap *)(local_98->x).pOther,pVal,pjVar8);
                      }
                      (pVal->sBlob).nByte = 0;
                      uVar3 = (pVal->sBlob).nFlags;
                      if ((uVar3 & 4) != 0) {
                        (pVal->sBlob).pBlob = (void *)0x0;
                        (pVal->sBlob).mByte = 0;
                        (pVal->sBlob).nFlags = uVar3 & 0xfffffffb;
                      }
                    }
                  }
                  else {
                    pjVar8 = (jx9_value *)pSVar7->pUserData;
                  }
                  if (pjVar8 != (jx9_value *)0x0) {
                    local_98 = pjVar8;
                  }
                }
                bVar9 = true;
                for (; (pbVar16 < pbVar17 && (*pbVar16 != 0x5d)); pbVar16 = pbVar16 + 1) {
                }
              }
              pbVar16 = pbVar16 + 1;
            } while (pbVar16 < pbVar17);
            bVar9 = !bVar9;
          }
          else {
            local_a4 = 0;
            bVar9 = true;
          }
          iVar11 = (int)pbVar16;
          uVar3 = iVar11 - (int)zIn;
          if (!bVar9) {
            uVar3 = local_a4;
          }
          uVar15 = (ulong)uVar3;
          if (uVar3 != 0) {
            do {
              bVar13 = *zIn;
              if ((0xffffffffffffffbf < (ulong)(long)(char)bVar13) ||
                 (ppuVar5 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar5 + (long)(char)bVar13 * 2 + 1) & 0x20) == 0))
              goto LAB_00137f0b;
              zIn = (char *)((byte *)zIn + 1);
              uVar3 = (int)uVar15 - 1;
              uVar15 = (ulong)uVar3;
            } while (uVar3 != 0);
            uVar15 = 0;
          }
LAB_00137f0b:
          do {
            uVar12 = uVar15;
            if (uVar12 == 0) goto joined_r0x00138009;
            bVar13 = ((byte *)zIn)[uVar12 - 1];
          } while (((ulong)(long)(char)bVar13 < 0xffffffffffffffc0) &&
                  (ppuVar5 = __ctype_b_loc(), uVar15 = uVar12 - 1,
                  (*(byte *)((long)*ppuVar5 + (long)(char)bVar13 * 2 + 1) & 0x20) != 0));
          if (bVar9) {
            jx9_value_string(pVal,zIn,(int)uVar12);
          }
          (pVal_00->sBlob).nByte = 0;
          uVar3 = (pVal_00->sBlob).nFlags;
          if ((uVar3 & 4) != 0) {
            (pVal_00->sBlob).pBlob = (void *)0x0;
            (pVal_00->sBlob).mByte = 0;
            (pVal_00->sBlob).nFlags = uVar3 & 0xfffffffb;
          }
          do {
            pbVar14 = pbVar16;
            iVar11 = iVar11 + 1;
            pbVar16 = pbVar14 + 1;
            zIn = (char *)pbVar16;
            if (pbVar17 <= pbVar16) goto LAB_0013825f;
            bVar13 = *pbVar16;
          } while (((ulong)(long)(char)bVar13 < 0xffffffffffffffc0) &&
                  (ppuVar5 = __ctype_b_loc(),
                  (*(byte *)((long)*ppuVar5 + (long)(char)bVar13 * 2 + 1) & 0x20) != 0));
          if ((bVar13 == 0x22) || (bVar13 == 0x27)) {
            pbVar6 = pbVar14 + 2;
            pbVar14 = pbVar16;
            while (pbVar19 = pbVar6, pbVar19 < pbVar17) {
              if ((*pbVar19 == bVar13) && (pbVar19[-1] != 0x5c)) {
                pbVar14 = pbVar19 + -1;
                break;
              }
              pbVar14 = pbVar19;
              pbVar6 = pbVar19 + 1;
            }
            zIn = (char *)(pbVar14 + 2);
            if (pbVar19 >= pbVar17) {
              zIn = (char *)pbVar19;
            }
          }
          else {
            for (; zIn < pbVar17; zIn = (char *)((byte *)zIn + 1)) {
              bVar1 = *zIn;
              if (bVar1 == 10) {
                if (((byte *)zIn)[-1] != 0x5c) break;
              }
              else if ((bVar1 == 0x23) || (bVar1 == 0x3b)) break;
            }
          }
          uVar3 = (int)zIn - iVar11;
          if (uVar3 != 0) {
            do {
              bVar1 = *pbVar16;
              if ((0xffffffffffffffbf < (ulong)(long)(char)bVar1) ||
                 (ppuVar5 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar5 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0))
              goto LAB_0013817b;
              pbVar16 = pbVar16 + 1;
              uVar3 = uVar3 - 1;
            } while (uVar3 != 0);
            uVar3 = 0;
          }
LAB_0013817b:
          uVar18 = ~uVar3;
          uVar15 = (ulong)uVar3;
          do {
            if (uVar15 == 0) {
              uVar15 = 0;
              goto LAB_001381b6;
            }
            bVar1 = pbVar16[uVar15 - 1];
            if (0xffffffffffffffbf < (ulong)(long)(char)bVar1) goto LAB_001381b6;
            ppuVar5 = __ctype_b_loc();
            uVar18 = uVar18 + 1;
            uVar15 = uVar15 - 1;
          } while ((*(byte *)((long)*ppuVar5 + (long)(char)bVar1 * 2 + 1) & 0x20) != 0);
          uVar15 = (ulong)-uVar18;
LAB_001381b6:
          iVar11 = (int)uVar15;
          if ((bVar13 == 0x27) || (bVar13 == 0x22)) {
            if (iVar11 != 0) {
              pbVar14 = pbVar16 + (ulong)(iVar11 - 1) + 1;
              do {
                if (*pbVar16 != bVar13) goto LAB_001381ea;
                pbVar16 = pbVar16 + 1;
                uVar3 = (int)uVar15 - 1;
                uVar15 = (ulong)uVar3;
              } while (uVar3 != 0);
              uVar15 = 0;
              pbVar16 = pbVar14;
            }
LAB_001381ea:
            iVar11 = (int)uVar15 + 1;
            uVar15 = uVar15 & 0xffffffff;
            do {
              if (uVar15 == 0) {
                iVar11 = 0;
                break;
              }
              iVar11 = iVar11 + -1;
              lVar2 = uVar15 - 1;
              uVar15 = uVar15 - 1;
            } while (pbVar16[lVar2] == bVar13);
          }
          if (iVar11 != 0) {
            jx9_value_string(pVal_00,(char *)pbVar16,iVar11);
          }
          if ((local_98->iFlags & 0x40) != 0) {
            pjVar8 = (jx9_value *)0x0;
            if (bVar9) {
              pjVar8 = pVal;
            }
            HashmapInsert((jx9_hashmap *)(local_98->x).pOther,pjVar8,pVal_00);
          }
        }
LAB_0013825f:
        bVar9 = zIn < pbVar17;
      } while (bVar9);
    }
LAB_0013826c:
    SyHashRelease(&local_70);
    uVar3 = jx9_result_value(pCtx,pjVar4);
  }
  return uVar3;
joined_r0x00138009:
  zIn = (char *)pbVar16;
  if (pbVar17 <= pbVar16) goto LAB_0013825f;
  bVar13 = *pbVar16;
  if ((0xffffffffffffffbf < (ulong)(long)(char)bVar13) ||
     ((ppuVar5 = __ctype_b_loc(), bVar13 != 0x3d && (((*ppuVar5)[(char)bVar13] & 0x2000) == 0))))
  goto LAB_0013825f;
  pbVar16 = pbVar16 + 1;
  goto joined_r0x00138009;
}

Assistant:

JX9_PRIVATE sxi32 jx9ParseIniString(jx9_context *pCtx, const char *zIn, sxu32 nByte, int bProcessSection)
{
	jx9_value *pCur, *pArray, *pSection, *pWorker, *pValue;
	const char *zCur, *zEnd = &zIn[nByte];
	SyHashEntry *pEntry;
	SyString sEntry;
	SyHash sHash;
	int c;
	/* Create an empty array and worker variables */
	pArray = jx9_context_new_array(pCtx);
	pWorker = jx9_context_new_scalar(pCtx);
	pValue = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pWorker == 0 || pValue == 0){
		/* Out of memory */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		/* Return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	SyHashInit(&sHash, &pCtx->pVm->sAllocator, 0, 0);
	pCur = pArray;
	/* Start the parse process */
	for(;;){
		/* Ignore leading white spaces */
		while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0])){
			zIn++;
		}
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		if( zIn[0] == ';' || zIn[0] == '#' ){
			/* Comment til the end of line */
			zIn++;
			while(zIn < zEnd && zIn[0] != '\n' ){
				zIn++;
			}
			continue;
		}
		/* Reset the string cursor of the working variable */
		jx9_value_reset_string_cursor(pWorker);
		if( zIn[0] == '[' ){
			/* Section: Extract the section name */
			zIn++;
			zCur = zIn;
			while( zIn < zEnd && zIn[0] != ']' ){
				zIn++;
			}
			if( zIn > zCur && bProcessSection ){
				/* Save the section name */
				SyStringInitFromBuf(&sEntry, zCur, (int)(zIn-zCur));
				SyStringFullTrim(&sEntry);
				jx9_value_string(pWorker, sEntry.zString, (int)sEntry.nByte);
				if( sEntry.nByte > 0 ){
					/* Associate an array with the section */
					pSection = jx9_context_new_array(pCtx);
					if( pSection ){
						jx9_array_add_elem(pArray, pWorker/*Section name*/, pSection);
						pCur = pSection;
					}
				}
			}
			zIn++; /* Trailing square brackets ']' */
		}else{
			jx9_value *pOldCur;
			int is_array;
			int iLen;
			/* Properties */
			is_array = 0;
			zCur = zIn;
			iLen = 0; /* cc warning */
			pOldCur = pCur;
			while( zIn < zEnd && zIn[0] != '=' ){
				if( zIn[0] == '[' && !is_array ){
					/* Array */
					iLen = (int)(zIn-zCur);
					is_array = 1;
					if( iLen > 0 ){
						jx9_value *pvArr = 0; /* cc warning */
						/* Query the hashtable */
						SyStringInitFromBuf(&sEntry, zCur, iLen);
						SyStringFullTrim(&sEntry);
						pEntry = SyHashGet(&sHash, (const void *)sEntry.zString, sEntry.nByte);
						if( pEntry ){
							pvArr = (jx9_value *)SyHashEntryGetUserData(pEntry);
						}else{
							/* Create an empty array */
							pvArr = jx9_context_new_array(pCtx);
							if( pvArr ){
								/* Save the entry */
								SyHashInsert(&sHash, (const void *)sEntry.zString, sEntry.nByte, pvArr);
								/* Insert the entry */
								jx9_value_reset_string_cursor(pWorker);
								jx9_value_string(pWorker, sEntry.zString, (int)sEntry.nByte);
								jx9_array_add_elem(pCur, pWorker, pvArr);
								jx9_value_reset_string_cursor(pWorker);
							}
						}
						if( pvArr ){
							pCur = pvArr;
						}
					}
					while ( zIn < zEnd && zIn[0] != ']' ){
						zIn++;
					}
				}
				zIn++;
			}
			if( !is_array ){
				iLen = (int)(zIn-zCur);
			}
			/* Trim the key */
			SyStringInitFromBuf(&sEntry, zCur, iLen);
			SyStringFullTrim(&sEntry);
			if( sEntry.nByte > 0 ){
				if( !is_array ){
					/* Save the key name */
					jx9_value_string(pWorker, sEntry.zString, (int)sEntry.nByte);
				}
				/* extract key value */
				jx9_value_reset_string_cursor(pValue);
				zIn++; /* '=' */
				while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0]) ){
					zIn++;
				}
				if( zIn < zEnd ){
					zCur = zIn;
					c = zIn[0];
					if( c == '"' || c == '\'' ){
						zIn++;
						/* Delimit the value */
						while( zIn < zEnd ){
							if ( zIn[0] == c && zIn[-1] != '\\' ){
								break;
							}
							zIn++;
						}
						if( zIn < zEnd ){
							zIn++;
						}
					}else{
						while( zIn < zEnd ){
							if( zIn[0] == '\n' ){
								if( zIn[-1] != '\\' ){
									break;
								}
							}else if( zIn[0] == ';' || zIn[0] == '#' ){
								/* Inline comments */
								break;
							}
							zIn++;
						}
					}
					/* Trim the value */
					SyStringInitFromBuf(&sEntry, zCur, (int)(zIn-zCur));
					SyStringFullTrim(&sEntry);
					if( c == '"' || c == '\'' ){
						SyStringTrimLeadingChar(&sEntry, c);
						SyStringTrimTrailingChar(&sEntry, c);
					}
					if( sEntry.nByte > 0 ){
						jx9_value_string(pValue, sEntry.zString, (int)sEntry.nByte);
					}
					/* Insert the key and it's value */
					jx9_array_add_elem(pCur, is_array ? 0 /*Automatic index assign */: pWorker, pValue);
				}
			}else{
				while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && ( SyisSpace(zIn[0]) || zIn[0] == '=' ) ){
					zIn++;
				}
			}
			pCur = pOldCur;
		}
	}
	SyHashRelease(&sHash);
	/* Return the parse of the INI string */
	jx9_result_value(pCtx, pArray);
	return SXRET_OK;
}